

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void xmlCheckEntityInAttValue(xmlParserCtxtPtr ctxt,xmlEntityPtr pent,int depth)

{
  char cVar1;
  int iVar2;
  xmlChar *name_00;
  xmlEntityPtr pent_00;
  xmlEntityPtr ent;
  xmlChar *name;
  uint local_38;
  int val;
  int flags;
  int c;
  unsigned_long expandedSize;
  xmlChar *str;
  int maxDepth;
  int depth_local;
  xmlEntityPtr pent_local;
  xmlParserCtxtPtr ctxt_local;
  
  str._0_4_ = 0x14;
  if ((ctxt->options & 0x80000U) != 0) {
    str._0_4_ = 0x28;
  }
  _flags = (unsigned_long)pent->length;
  str._4_4_ = depth + 1;
  _maxDepth = pent;
  pent_local = (xmlEntityPtr)ctxt;
  if ((int)str < str._4_4_) {
    xmlFatalErrMsg(ctxt,XML_ERR_RESOURCE_LIMIT,"Maximum entity nesting depth exceeded");
  }
  else if ((pent->flags & 8U) == 0) {
    if (ctxt->inSubset == 0) {
      local_38 = 6;
    }
    else {
      local_38 = 4;
    }
    expandedSize = (unsigned_long)pent->content;
    if ((xmlChar *)expandedSize != (xmlChar *)0x0) {
      do {
        while( true ) {
          while( true ) {
            if (1 < *(int *)((long)&pent_local[2].parent + 4)) goto LAB_0015299a;
            cVar1 = *(char *)expandedSize;
            if (cVar1 == '&') break;
            if (cVar1 == '\0') goto LAB_0015299a;
            if (cVar1 == '<') {
              xmlFatalErrMsgStr((xmlParserCtxtPtr)pent_local,XML_ERR_LT_IN_ATTRIBUTE,
                                "\'<\' in entity \'%s\' is not allowed in attributes values\n",
                                _maxDepth->name);
            }
            expandedSize = expandedSize + 1;
          }
          if (*(char *)(expandedSize + 1) == '#') break;
          name_00 = xmlParseStringEntityRef((xmlParserCtxtPtr)pent_local,(xmlChar **)&expandedSize);
          if (name_00 == (xmlChar *)0x0) {
            *_maxDepth->content = '\0';
            goto LAB_0015299a;
          }
          pent_00 = xmlLookupGeneralEntity((xmlParserCtxtPtr)pent_local,name_00,1);
          (*xmlFree)(name_00);
          if ((pent_00 != (xmlEntityPtr)0x0) && (pent_00->etype != XML_INTERNAL_PREDEFINED_ENTITY))
          {
            if ((pent_00->flags & local_38) != local_38) {
              _maxDepth->flags = _maxDepth->flags | 8;
              xmlCheckEntityInAttValue((xmlParserCtxtPtr)pent_local,pent_00,str._4_4_);
              _maxDepth->flags = _maxDepth->flags & 0xfffffff7;
            }
            xmlSaturatedAdd((unsigned_long *)&flags,pent_00->expandedSize);
            xmlSaturatedAdd((unsigned_long *)&flags,0x14);
          }
        }
        iVar2 = xmlParseStringCharRef((xmlParserCtxtPtr)pent_local,(xmlChar **)&expandedSize);
      } while (iVar2 != 0);
      *_maxDepth->content = '\0';
    }
LAB_0015299a:
    if (*(int *)&pent_local[2].next == 0) {
      _maxDepth->expandedSize = _flags;
    }
    _maxDepth->flags = local_38 | _maxDepth->flags;
  }
  else {
    xmlFatalErr(ctxt,XML_ERR_ENTITY_LOOP,(char *)0x0);
    xmlHaltParser((xmlParserCtxtPtr)pent_local);
  }
  return;
}

Assistant:

static void
xmlCheckEntityInAttValue(xmlParserCtxtPtr ctxt, xmlEntityPtr pent, int depth) {
    int maxDepth = (ctxt->options & XML_PARSE_HUGE) ? 40 : 20;
    const xmlChar *str;
    unsigned long expandedSize = pent->length;
    int c, flags;

    depth += 1;
    if (depth > maxDepth) {
	xmlFatalErrMsg(ctxt, XML_ERR_RESOURCE_LIMIT,
                       "Maximum entity nesting depth exceeded");
	return;
    }

    if (pent->flags & XML_ENT_EXPANDING) {
        xmlFatalErr(ctxt, XML_ERR_ENTITY_LOOP, NULL);
        xmlHaltParser(ctxt);
        return;
    }

    /*
     * If we're parsing a default attribute value in DTD content,
     * the entity might reference other entities which weren't
     * defined yet, so the check isn't reliable.
     */
    if (ctxt->inSubset == 0)
        flags = XML_ENT_CHECKED | XML_ENT_VALIDATED;
    else
        flags = XML_ENT_VALIDATED;

    str = pent->content;
    if (str == NULL)
        goto done;

    /*
     * Note that entity values are already validated. We only check
     * for illegal less-than signs and compute the expanded size
     * of the entity. No special handling for multi-byte characters
     * is needed.
     */
    while (!PARSER_STOPPED(ctxt)) {
        c = *str;

	if (c != '&') {
            if (c == 0)
                break;

            if (c == '<')
                xmlFatalErrMsgStr(ctxt, XML_ERR_LT_IN_ATTRIBUTE,
                        "'<' in entity '%s' is not allowed in attributes "
                        "values\n", pent->name);

            str += 1;
        } else if (str[1] == '#') {
            int val;

	    val = xmlParseStringCharRef(ctxt, &str);
	    if (val == 0) {
                pent->content[0] = 0;
                break;
            }
	} else {
            xmlChar *name;
            xmlEntityPtr ent;

	    name = xmlParseStringEntityRef(ctxt, &str);
	    if (name == NULL) {
                pent->content[0] = 0;
                break;
            }

            ent = xmlLookupGeneralEntity(ctxt, name, /* inAttr */ 1);
            xmlFree(name);

            if ((ent != NULL) &&
                (ent->etype != XML_INTERNAL_PREDEFINED_ENTITY)) {
                if ((ent->flags & flags) != flags) {
                    pent->flags |= XML_ENT_EXPANDING;
                    xmlCheckEntityInAttValue(ctxt, ent, depth);
                    pent->flags &= ~XML_ENT_EXPANDING;
                }

                xmlSaturatedAdd(&expandedSize, ent->expandedSize);
                xmlSaturatedAdd(&expandedSize, XML_ENT_FIXED_COST);
            }
        }
    }

done:
    if (ctxt->inSubset == 0)
        pent->expandedSize = expandedSize;

    pent->flags |= flags;
}